

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseConditionalSections(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t local_60;
  uint cons;
  xmlChar *check;
  size_t ignoreDepth;
  xmlParserInputState instate;
  int state;
  int *tmp;
  ulong uStack_28;
  int id;
  size_t depth;
  size_t inputIdsSize;
  int *inputIds;
  xmlParserCtxtPtr ctxt_local;
  
  inputIdsSize = 0;
  depth = 0;
  uStack_28 = 0;
  do {
    if (ctxt->instate == XML_PARSER_EOF) {
LAB_001854eb:
      (*xmlFree)((void *)inputIdsSize);
      return;
    }
    if (((((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '<')) &&
         (ctxt->input->cur[1] == '!')) && (ctxt->input->cur[2] == '[')) ||
       (((ctxt->mlType == XML_TYPE_SML && (*ctxt->input->cur == '!')) &&
        (ctxt->input->cur[1] == '[')))) {
      iVar7 = ctxt->input->id;
      iVar5 = 2;
      if (ctxt->mlType == XML_TYPE_XML) {
        iVar5 = 3;
      }
      ctxt->input->cur = ctxt->input->cur + iVar5;
      iVar5 = 2;
      if (ctxt->mlType == XML_TYPE_XML) {
        iVar5 = 3;
      }
      ctxt->input->col = iVar5 + ctxt->input->col;
      if (*ctxt->input->cur == '\0') {
        xmlParserInputGrow(ctxt->input,0xfa);
      }
      xmlSkipBlankChars(ctxt);
      if (((*ctxt->input->cur == 'I') && (ctxt->input->cur[1] == 'N')) &&
         (((ctxt->input->cur[2] == 'C' &&
           (((ctxt->input->cur[3] == 'L' && (ctxt->input->cur[4] == 'U')) &&
            (ctxt->input->cur[5] == 'D')))) && (ctxt->input->cur[6] == 'E')))) {
        ctxt->input->cur = ctxt->input->cur + 7;
        ctxt->input->col = ctxt->input->col + 7;
        if (*ctxt->input->cur == '\0') {
          xmlParserInputGrow(ctxt->input,0xfa);
        }
        xmlSkipBlankChars(ctxt);
        if (*ctxt->input->cur != '[') {
          xmlFatalErr(ctxt,XML_ERR_CONDSEC_INVALID,(char *)0x0);
          xmlHaltParser(ctxt);
          goto LAB_001854eb;
        }
        if (ctxt->input->id != iVar7) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
        }
        xmlNextChar(ctxt);
        pvVar4 = (void *)inputIdsSize;
        if (depth <= uStack_28) {
          if (depth == 0) {
            local_60 = 4;
          }
          else {
            local_60 = depth << 1;
          }
          depth = local_60;
          pvVar4 = (*xmlRealloc)((void *)inputIdsSize,local_60 << 2);
          if (pvVar4 == (void *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            goto LAB_001854eb;
          }
        }
        inputIdsSize = (size_t)pvVar4;
        *(int *)(inputIdsSize + uStack_28 * 4) = iVar7;
        uStack_28 = uStack_28 + 1;
      }
      else {
        if (((*ctxt->input->cur != 'I') || (ctxt->input->cur[1] != 'G')) ||
           (((ctxt->input->cur[2] != 'N' ||
             ((ctxt->input->cur[3] != 'O' || (ctxt->input->cur[4] != 'R')))) ||
            (ctxt->input->cur[5] != 'E')))) {
          xmlFatalErr(ctxt,XML_ERR_CONDSEC_INVALID_KEYWORD,(char *)0x0);
          xmlHaltParser(ctxt);
          goto LAB_001854eb;
        }
        check = (xmlChar *)0x0;
        ctxt->input->cur = ctxt->input->cur + 6;
        ctxt->input->col = ctxt->input->col + 6;
        if (*ctxt->input->cur == '\0') {
          xmlParserInputGrow(ctxt->input,0xfa);
        }
        xmlSkipBlankChars(ctxt);
        if (*ctxt->input->cur != '[') {
          xmlFatalErr(ctxt,XML_ERR_CONDSEC_INVALID,(char *)0x0);
          xmlHaltParser(ctxt);
          goto LAB_001854eb;
        }
        if (ctxt->input->id != iVar7) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
        }
        xmlNextChar(ctxt);
        iVar5 = ctxt->disableSAX;
        xVar1 = ctxt->instate;
        if (ctxt->recovery == 0) {
          ctxt->disableSAX = 1;
        }
        ctxt->instate = XML_PARSER_IGNORE;
        while (*ctxt->input->cur != '\0') {
          if (((((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '<')) &&
               (ctxt->input->cur[1] == '!')) && (ctxt->input->cur[2] == '[')) ||
             (((ctxt->mlType == XML_TYPE_SML && (*ctxt->input->cur == '!')) &&
              (ctxt->input->cur[1] == '[')))) {
            iVar6 = 2;
            if (ctxt->mlType == XML_TYPE_XML) {
              iVar6 = 3;
            }
            ctxt->input->cur = ctxt->input->cur + iVar6;
            iVar6 = 2;
            if (ctxt->mlType == XML_TYPE_XML) {
              iVar6 = 3;
            }
            ctxt->input->col = iVar6 + ctxt->input->col;
            if (*ctxt->input->cur == '\0') {
              xmlParserInputGrow(ctxt->input,0xfa);
            }
            check = check + 1;
            if (check == (xmlChar *)0x0) {
              xmlErrMemory(ctxt,(char *)0x0);
              goto LAB_001854eb;
            }
          }
          else if (((*ctxt->input->cur == ']') && (ctxt->input->cur[1] == ']')) &&
                  ((ctxt->mlType == XML_TYPE_SML || (ctxt->input->cur[2] == '>')))) {
            if (check == (xmlChar *)0x0) break;
            iVar6 = 2;
            if (ctxt->mlType == XML_TYPE_XML) {
              iVar6 = 3;
            }
            ctxt->input->cur = ctxt->input->cur + iVar6;
            iVar6 = 2;
            if (ctxt->mlType == XML_TYPE_XML) {
              iVar6 = 3;
            }
            ctxt->input->col = iVar6 + ctxt->input->col;
            if (*ctxt->input->cur == '\0') {
              xmlParserInputGrow(ctxt->input,0xfa);
            }
            check = check + -1;
          }
          else {
            xmlNextChar(ctxt);
          }
        }
        ctxt->disableSAX = iVar5;
        ctxt->instate = xVar1;
        if (*ctxt->input->cur == '\0') {
          xmlFatalErr(ctxt,XML_ERR_CONDSEC_NOT_FINISHED,(char *)0x0);
          goto LAB_001854eb;
        }
        if (ctxt->input->id != iVar7) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
        }
        ctxt->input->cur = ctxt->input->cur + 3;
        ctxt->input->col = ctxt->input->col + 3;
        if (*ctxt->input->cur == '\0') {
          xmlParserInputGrow(ctxt->input,0xfa);
        }
      }
    }
    else if ((((uStack_28 == 0) || (*ctxt->input->cur != ']')) || (ctxt->input->cur[1] != ']')) ||
            ((ctxt->mlType != XML_TYPE_SML && (ctxt->input->cur[2] != '>')))) {
      pxVar2 = ctxt->input->cur;
      uVar3 = ctxt->input->consumed;
      xmlParseMarkupDecl(ctxt);
      if ((ctxt->input->cur == pxVar2) && ((uVar3 & 0xffffffff) == ctxt->input->consumed)) {
        xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
        xmlHaltParser(ctxt);
        goto LAB_001854eb;
      }
    }
    else {
      uStack_28 = uStack_28 - 1;
      if (ctxt->input->id != *(int *)(inputIdsSize + uStack_28 * 4)) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "All markup of the conditional section is not in the same entity\n");
      }
      iVar7 = 2;
      if (ctxt->mlType == XML_TYPE_XML) {
        iVar7 = 3;
      }
      ctxt->input->cur = ctxt->input->cur + iVar7;
      iVar7 = 2;
      if (ctxt->mlType == XML_TYPE_XML) {
        iVar7 = 3;
      }
      ctxt->input->col = iVar7 + ctxt->input->col;
      if (*ctxt->input->cur == '\0') {
        xmlParserInputGrow(ctxt->input,0xfa);
      }
    }
    if (uStack_28 == 0) goto LAB_001854eb;
    xmlSkipBlankChars(ctxt);
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
  } while( true );
}

Assistant:

static void
xmlParseConditionalSections(xmlParserCtxtPtr ctxt) {
    int *inputIds = NULL;
    size_t inputIdsSize = 0;
    size_t depth = 0;

    DEBUG_ENTER(("xmlParseConditionalSections(%s);\n", dbgCtxt(ctxt)));

    while (ctxt->instate != XML_PARSER_EOF) {
        if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
            int id = ctxt->input->id;

            SKIP_MLI(3);	/* '<', '!', '[' */
            SKIP_BLANKS;

            if (CMP7(CUR_PTR, 'I', 'N', 'C', 'L', 'U', 'D', 'E')) {
                SKIP(7);
                SKIP_BLANKS;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                if (inputIdsSize <= depth) {
                    int *tmp;

                    inputIdsSize = (inputIdsSize == 0 ? 4 : inputIdsSize * 2);
                    tmp = (int *) xmlRealloc(inputIds,
                            inputIdsSize * sizeof(int));
                    if (tmp == NULL) {
                        xmlErrMemory(ctxt, NULL);
                        goto error;
                    }
                    inputIds = tmp;
                }
                inputIds[depth] = id;
                depth++;
            } else if (CMP6(CUR_PTR, 'I', 'G', 'N', 'O', 'R', 'E')) {
                int state;
                xmlParserInputState instate;
                size_t ignoreDepth = 0;

                SKIP(6);
                SKIP_BLANKS;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                /*
                 * Parse up to the end of the conditional section but disable
                 * SAX event generating DTD building in the meantime
                 */
                state = ctxt->disableSAX;
                instate = ctxt->instate;
                if (ctxt->recovery == 0) ctxt->disableSAX = 1;
                ctxt->instate = XML_PARSER_IGNORE;

                while (RAW != 0) {
                    if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
                        SKIP_MLI(3);
                        ignoreDepth++;
                        /* Check for integer overflow */
                        if (ignoreDepth == 0) {
                            xmlErrMemory(ctxt, NULL);
                            goto error;
                        }
                    } else if ((RAW == ']') && (NXT(1) == ']') &&
                               (ISSML || (NXT(2) == '>'))) {
                        if (ignoreDepth == 0)
                            break;
                        SKIP_MLI(3);
                        ignoreDepth--;
                    } else {
                        NEXT;
                    }
                }

                ctxt->disableSAX = state;
                ctxt->instate = instate;

		if (RAW == 0) {
		    xmlFatalErr(ctxt, XML_ERR_CONDSEC_NOT_FINISHED, NULL);
                    goto error;
		}
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                SKIP(3);
            } else {
                xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID_KEYWORD, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        } else if ((depth > 0) &&
                   (RAW == ']') && (NXT(1) == ']') && (ISSML || (NXT(2) == '>'))) {
            depth--;
            if (ctxt->input->id != inputIds[depth]) {
                xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not"
                               " in the same entity\n");
            }
            SKIP_MLI(3);
        } else {
            const xmlChar *check = CUR_PTR;
            unsigned int cons = ctxt->input->consumed;

            xmlParseMarkupDecl(ctxt);

            if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
                xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        }

        if (depth == 0)
            break;

        SKIP_BLANKS;
        GROW;
    }

error:
    xmlFree(inputIds);
    RETURN();
}